

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttachedPart.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::AttachedPart::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,AttachedPart *this)

{
  ostream *poVar1;
  KINT32 Value;
  char *pcVar2;
  KStringStream ss;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Attached Part:");
  poVar1 = std::operator<<(poVar1,"\n\tDetached:             ");
  pcVar2 = "True";
  if (this->m_ui8DetachedIndicator == '\0') {
    pcVar2 = "False";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"\n\tPart Attached To ID:  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16PartAttachedToID);
  poVar1 = std::operator<<(poVar1,"\n\tParameter Type:       ");
  ENUMS::GetEnumAsStringAttachedPartParameterType_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)this->m_ui32APPT,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\n\tType:                 ");
  EntityType::GetAsString_abi_cxx11_(&local_1e0,&this->m_AttachedPartType);
  std::operator<<(poVar1,(string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString AttachedPart::GetAsString() const
{
    KStringStream ss;

    ss << "Attached Part:"
       << "\n\tDetached:             " << ( m_ui8DetachedIndicator == 0 ? "False" : "True" )
       << "\n\tPart Attached To ID:  " << m_ui16PartAttachedToID
       << "\n\tParameter Type:       " << GetEnumAsStringAttachedPartParameterType( m_ui32APPT )
       << "\n\tType:                 " << m_AttachedPartType.GetAsString();

    return ss.str();
}